

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration
          (DescriptorBuilder *this,string_view full_name,
          RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *declarations,
          DescriptorProto_ExtensionRange *proto,
          flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *full_name_set)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_04;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  undefined8 this_00;
  bool bVar1;
  bool bVar2;
  int32_t iVar3;
  int32_t iVar4;
  uint uVar5;
  string *psVar6;
  DescriptorProto_ExtensionRange *pDVar7;
  char *pcVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  string_view type;
  string_view symbol;
  string_view symbol_00;
  anon_class_40_1_ba1d44c5 local_290;
  VoidPtr local_268;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_260;
  size_t local_258;
  char *pcStack_250;
  undefined1 local_248 [16];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  undefined1 local_210 [16];
  anon_class_40_1_ba1d44c5 local_200;
  VoidPtr local_1d8;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_1d0;
  size_t local_1c8;
  char *pcStack_1c0;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> err;
  anon_class_8_1_98a85fda local_170;
  VoidPtr local_168;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_160;
  string_view local_158;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
  local_148;
  anon_class_8_1_98a85fda local_130;
  VoidPtr local_128;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_120;
  size_t local_118;
  char *pcStack_110;
  anon_class_8_1_98a85fda local_100;
  VoidPtr local_f8;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_f0;
  size_t local_e8;
  char *pcStack_e0;
  int32_t local_cc;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>::iterator,_bool>
  local_c8;
  anon_class_8_1_98a85fda local_b0;
  VoidPtr local_a8;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_a0;
  size_t local_98;
  char *pcStack_90;
  reference local_88;
  ExtensionRangeOptions_Declaration *declaration;
  const_iterator __end2;
  iterator local_68;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *__range2;
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  extension_number_set;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *full_name_set_local;
  DescriptorProto_ExtensionRange *proto_local;
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *declarations_local;
  DescriptorBuilder *this_local;
  string_view full_name_local;
  
  pcVar8 = full_name._M_str;
  sVar9 = full_name._M_len;
  extension_number_set.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)full_name_set;
  absl::lts_20250127::
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::flat_hash_set((flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                   *)&__range2);
  __begin2.it_ = (void **)declarations;
  local_68.it_ = (void **)RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>::
                          begin(declarations);
  declaration = (ExtensionRangeOptions_Declaration *)
                RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>::end
                          ((RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)
                           __begin2.it_);
  do {
    bVar1 = internal::operator!=(&local_68,(iterator *)&declaration);
    if (!bVar1) {
      err.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._36_4_ = 0;
LAB_005e50ce:
      absl::lts_20250127::
      flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
      ::~flat_hash_set((flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *)&__range2);
      return;
    }
    local_88 = internal::
               RepeatedPtrIterator<const_google::protobuf::ExtensionRangeOptions_Declaration>::
               operator*(&local_68);
    iVar3 = ExtensionRangeOptions_Declaration::number(local_88);
    iVar4 = DescriptorProto_ExtensionRange::start(proto);
    if (iVar3 < iVar4) {
LAB_005e4aee:
      local_b0.declaration = local_88;
      local_98 = sVar9;
      pcStack_90 = pcVar8;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__0,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_a8,&local_b0);
      element_name_03._M_str = pcStack_90;
      element_name_03._M_len = local_98;
      make_error.invoker_ = p_Stack_a0;
      make_error.ptr_.obj = local_a8.obj;
      pDVar7 = proto;
      AddError(this,element_name_03,&proto->super_Message,NUMBER,make_error);
    }
    else {
      iVar3 = ExtensionRangeOptions_Declaration::number(local_88);
      uVar5 = DescriptorProto_ExtensionRange::end(proto);
      pDVar7 = (DescriptorProto_ExtensionRange *)(ulong)uVar5;
      if ((int)uVar5 <= iVar3) goto LAB_005e4aee;
    }
    local_cc = ExtensionRangeOptions_Declaration::number(local_88);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
    ::insert(&local_c8,
             (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
              *)&__range2,&local_cc);
    if (((local_c8.second ^ 0xffU) & 1) != 0) {
      local_100.declaration = local_88;
      local_e8 = sVar9;
      pcStack_e0 = pcVar8;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__1,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_f8,&local_100);
      element_name_02._M_str = pcStack_e0;
      element_name_02._M_len = local_e8;
      make_error_00.invoker_ = p_Stack_f0;
      make_error_00.ptr_.obj = local_f8.obj;
      pDVar7 = proto;
      AddError(this,element_name_02,&proto->super_Message,NUMBER,make_error_00);
    }
    bVar1 = ExtensionRangeOptions_Declaration::has_full_name(local_88);
    if (bVar1) {
      bVar1 = ExtensionRangeOptions_Declaration::has_type(local_88);
      this_00 = extension_number_set.
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.heap_or_soo_.heap.slot_array;
      if (!bVar1) goto LAB_005e4c5d;
      psVar6 = ExtensionRangeOptions_Declaration::full_name_abi_cxx11_(local_88);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_148,
                 (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)this_00,psVar6);
      if (((local_148.second ^ 0xffU) & 1) != 0) {
        psVar6 = ExtensionRangeOptions_Declaration::full_name_abi_cxx11_(local_88);
        local_158 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
        local_170.declaration = local_88;
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__3,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_168,&local_170);
        make_error_02.invoker_ = p_Stack_160;
        make_error_02.ptr_.obj = local_168.obj;
        AddError(this,local_158,&proto->super_Message,NAME,make_error_02);
        err.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._36_4_ = 1;
        goto LAB_005e50ce;
      }
      psVar6 = ExtensionRangeOptions_Declaration::full_name_abi_cxx11_(local_88);
      auVar10 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
      symbol._M_len = auVar10._8_8_;
      symbol._M_str = (char *)pDVar7;
      local_1b0 = auVar10;
      protobuf::(anonymous_namespace)::ValidateSymbolForDeclaration_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1a0,auVar10._0_8_,symbol);
      bVar1 = std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_1a0);
      if (bVar1) {
        local_1c8 = sVar9;
        pcStack_1c0 = pcVar8;
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional(&local_200.err,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1a0);
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__4,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_1d8,&local_200);
        element_name_00._M_str = pcStack_1c0;
        element_name_00._M_len = local_1c8;
        make_error_03.invoker_ = p_Stack_1d0;
        make_error_03.ptr_.obj = local_1d8.obj;
        pDVar7 = proto;
        AddError(this,element_name_00,&proto->super_Message,NAME,make_error_03);
        ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)
        ::$_4::~__4((__4 *)&local_200);
      }
      psVar6 = ExtensionRangeOptions_Declaration::type_abi_cxx11_(local_88);
      auVar10 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
      type._M_str = auVar10._8_8_;
      type._M_len = (size_t)type._M_str;
      local_210 = auVar10;
      bVar1 = anon_unknown_24::IsNonMessageType(auVar10._0_8_,type);
      if (!bVar1) {
        psVar6 = ExtensionRangeOptions_Declaration::type_abi_cxx11_(local_88);
        auVar10 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
        symbol_00._M_len = auVar10._8_8_;
        symbol_00._M_str = (char *)pDVar7;
        local_248 = auVar10;
        protobuf::(anonymous_namespace)::ValidateSymbolForDeclaration_abi_cxx11_
                  (&local_238,auVar10._0_8_,symbol_00);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator=((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1a0,&local_238);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional(&local_238);
        bVar1 = std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_1a0);
        if (bVar1) {
          local_258 = sVar9;
          pcStack_250 = pcVar8;
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::optional(&local_290.err,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1a0);
          absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
          FunctionRef<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__5,void>
                    ((FunctionRef<std::__cxx11::string()> *)&local_268,&local_290);
          element_name._M_str = pcStack_250;
          element_name._M_len = local_258;
          make_error_04.invoker_ = p_Stack_260;
          make_error_04.ptr_.obj = local_268.obj;
          AddError(this,element_name,&proto->super_Message,NAME,make_error_04);
          ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)
          ::$_5::~__5((__5 *)&local_290);
        }
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1a0);
    }
    else {
LAB_005e4c5d:
      bVar1 = ExtensionRangeOptions_Declaration::has_full_name(local_88);
      bVar2 = ExtensionRangeOptions_Declaration::has_type(local_88);
      if (bVar1 == bVar2) {
        bVar1 = ExtensionRangeOptions_Declaration::reserved(local_88);
        if (bVar1) goto LAB_005e50b2;
      }
      local_130.declaration = local_88;
      local_118 = sVar9;
      pcStack_110 = pcVar8;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__2,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_128,&local_130);
      element_name_01._M_str = pcStack_110;
      element_name_01._M_len = local_118;
      make_error_01.invoker_ = p_Stack_120;
      make_error_01.ptr_.obj = local_128.obj;
      AddError(this,element_name_01,&proto->super_Message,EXTENDEE,make_error_01);
    }
LAB_005e50b2:
    internal::RepeatedPtrIterator<const_google::protobuf::ExtensionRangeOptions_Declaration>::
    operator++(&local_68);
  } while( true );
}

Assistant:

void DescriptorBuilder::ValidateExtensionDeclaration(
    const absl::string_view full_name,
    const RepeatedPtrField<ExtensionRangeOptions_Declaration>& declarations,
    const DescriptorProto_ExtensionRange& proto,
    absl::flat_hash_set<absl::string_view>& full_name_set) {
  absl::flat_hash_set<int> extension_number_set;
  for (const auto& declaration : declarations) {
    if (declaration.number() < proto.start() ||
        declaration.number() >= proto.end()) {
      AddError(full_name, proto, DescriptorPool::ErrorCollector::NUMBER, [&] {
        return absl::Substitute(
            "Extension declaration number $0 is not in the "
            "extension range.",
            declaration.number());
      });
    }

    if (!extension_number_set.insert(declaration.number()).second) {
      AddError(full_name, proto, DescriptorPool::ErrorCollector::NUMBER, [&] {
        return absl::Substitute(
            "Extension declaration number $0 is declared multiple times.",
            declaration.number());
      });
    }

    // Both full_name and type should be present. If none of them is set,
    // add an error unless reserved is set to true. If only one of them is set,
    // add an error whether or not reserved is set to true.
    if (!declaration.has_full_name() || !declaration.has_type()) {
      if (declaration.has_full_name() != declaration.has_type() ||
          !declaration.reserved()) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::EXTENDEE,
                 [&] {
                   return absl::StrCat(
                       "Extension declaration #", declaration.number(),
                       " should have both \"full_name\" and \"type\" set.");
                 });
      }
    } else {
      if (!full_name_set.insert(declaration.full_name()).second) {
        AddError(
            declaration.full_name(), proto,
            DescriptorPool::ErrorCollector::NAME, [&] {
              return absl::Substitute(
                  "Extension field name \"$0\" is declared multiple times.",
                  declaration.full_name());
            });
        return;
      }
      absl::optional<std::string> err =
          ValidateSymbolForDeclaration(declaration.full_name());
      if (err.has_value()) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 [err] { return *err; });
      }
      if (!IsNonMessageType(declaration.type())) {
        err = ValidateSymbolForDeclaration(declaration.type());
        if (err.has_value()) {
          AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                   [err] { return *err; });
        }
      }
    }
  }
}